

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O3

int cfg_avlcmp_keys(void *p1,void *p2)

{
  int iVar1;
  char *str2;
  char *str1;
  
  if (p1 == (void *)0x0) {
    return -(uint)(p2 != (void *)0x0);
  }
  if (p2 == (void *)0x0) {
    return 1;
  }
  iVar1 = strcasecmp((char *)p1,(char *)p2);
  return iVar1;
}

Assistant:

int
cfg_avlcmp_keys(const void *p1, const void *p2) {
  const char *str1 = p1;
  const char *str2 = p2;

  if (str1 == NULL) {
    return str2 == NULL ? 0 : -1;
  }
  if (str2 == NULL) {
    return 1;
  }

  return strcasecmp(str1, str2);
}